

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableEndCell(ImGuiTable *table)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiTableColumn *pIVar3;
  long lVar4;
  uint uVar5;
  float fVar6;
  
  pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,table->CurrentColumn);
  pIVar2 = table->InnerWindow;
  if ((table->field_0x88 & 1) == 0) {
    lVar4 = (ulong)table->IsUnfrozen * 4 + 0x44;
  }
  else {
    lVar4 = 0x4c;
  }
  fVar6 = *(float *)((long)&(pIVar3->ClipRect).Min.x + lVar4);
  fVar1 = (pIVar2->DC).CursorMaxPos.x;
  uVar5 = -(uint)(fVar1 <= fVar6);
  *(uint *)((long)&(pIVar3->ClipRect).Min.x + lVar4) = ~uVar5 & (uint)fVar1 | (uint)fVar6 & uVar5;
  fVar6 = (pIVar2->DC).CursorMaxPos.y + table->CellPaddingY;
  uVar5 = -(uint)(fVar6 <= table->RowPosY2);
  table->RowPosY2 = (float)(uVar5 & (uint)table->RowPosY2 | ~uVar5 & (uint)fVar6);
  pIVar3->ItemWidth = (pIVar2->DC).ItemWidth;
  fVar6 = (pIVar2->DC).PrevLineTextBaseOffset;
  uVar5 = -(uint)(fVar6 <= table->RowTextBaseline);
  table->RowTextBaseline = (float)(~uVar5 & (uint)fVar6 | (uint)table->RowTextBaseline & uVar5);
  return;
}

Assistant:

void    ImGui::TableEndCell(ImGuiTable* table)
{
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];
    ImGuiWindow* window = table->InnerWindow;

    // Report maximum position so we can infer content size per column.
    float* p_max_pos_x;
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
        p_max_pos_x = &column->ContentMaxXHeadersUsed;  // Useful in case user submit contents in header row that is not a TableHeader() call
    else
        p_max_pos_x = table->IsUnfrozen ? &column->ContentMaxXUnfrozen : &column->ContentMaxXFrozen;
    *p_max_pos_x = ImMax(*p_max_pos_x, window->DC.CursorMaxPos.x);
    table->RowPosY2 = ImMax(table->RowPosY2, window->DC.CursorMaxPos.y + table->CellPaddingY);
    column->ItemWidth = window->DC.ItemWidth;

    // Propagate text baseline for the entire row
    // FIXME-TABLE: Here we propagate text baseline from the last line of the cell.. instead of the first one.
    table->RowTextBaseline = ImMax(table->RowTextBaseline, window->DC.PrevLineTextBaseOffset);
}